

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

void __thiscall rest_rpc::rpc_client::send_subscribe(rpc_client *this,string *key,string *token)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  buffer_type ret;
  msgpack_codec codec;
  
  codec.msg_.m_obj.super_object.type = NIL;
  codec.msg_.m_zone._M_t.
  super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
  super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
  super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
       (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
       (__uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>)0x0;
  rpc_service::msgpack_codec::pack_args<std::__cxx11::string_const&,std::__cxx11::string_const&>
            (&ret,(msgpack_codec *)key,token,in_RCX);
  MD5::MD5Hash32((key->_M_dataplus)._M_p);
  write(this,0,(void *)0x1,(size_t)&ret);
  free(ret.m_data);
  std::unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>::~unique_ptr
            (&codec.msg_.m_zone);
  return;
}

Assistant:

void send_subscribe(const std::string &key, const std::string &token) {
    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(key, token);
    write(0, request_type::sub_pub, std::move(ret), MD5::MD5Hash32(key.data()));
  }